

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void ARGBToUV444Row_C(uint8_t *src_argb,uint8_t *dst_u,uint8_t *dst_v,int width)

{
  uint8_t b;
  uint8_t g;
  uint8_t r;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)width;
  if (width < 1) {
    uVar2 = uVar3;
  }
  for (; (int)uVar2 != (int)uVar3; uVar3 = uVar3 + 1) {
    b = src_argb[uVar3 * 4];
    g = src_argb[uVar3 * 4 + 1];
    r = src_argb[uVar3 * 4 + 2];
    iVar1 = libyuv::RGBToU(r,g,b);
    dst_u[uVar3] = (uint8_t)iVar1;
    iVar1 = libyuv::RGBToV(r,g,b);
    dst_v[uVar3] = (uint8_t)iVar1;
  }
  return;
}

Assistant:

void ARGBToUV444Row_C(const uint8_t* src_argb,
                      uint8_t* dst_u,
                      uint8_t* dst_v,
                      int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t ab = src_argb[0];
    uint8_t ag = src_argb[1];
    uint8_t ar = src_argb[2];
    dst_u[0] = RGBToU(ar, ag, ab);
    dst_v[0] = RGBToV(ar, ag, ab);
    src_argb += 4;
    dst_u += 1;
    dst_v += 1;
  }
}